

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiPopupData *pIVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  ImGuiPopupData *pIVar10;
  long lVar11;
  int iVar12;
  ImVec2 *pIVar13;
  int iVar14;
  ImGuiContext *ctx;
  ImVec2 local_38;
  
  pIVar8 = GImGui;
  iVar12 = (GImGui->OpenPopupStack).Size;
  iVar9 = (GImGui->BeginPopupStack).Size;
  if (((byte)popup_flags >> 5 & iVar9 < iVar12) == 0) {
    pIVar4 = GImGui->NavWindow;
    iVar2 = GImGui->FrameCount;
    uVar3 = (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
    IVar7 = NavCalcPreferredRefPos();
    local_38 = IVar7;
    pIVar13 = &(pIVar8->IO).MousePos;
    if ((pIVar8->IO).MousePos.y < -256000.0 || (pIVar8->IO).MousePos.x < -256000.0) {
      pIVar13 = &local_38;
    }
    IVar5 = *pIVar13;
    if (iVar9 < iVar12) {
      pIVar10 = (pIVar8->OpenPopupStack).Data;
      if ((pIVar10[iVar9].PopupId == id) && (pIVar10[iVar9].OpenFrameCount == iVar2 + -1)) {
        pIVar10[iVar9].OpenFrameCount = iVar2;
        return;
      }
      ClosePopupToLevel(iVar9,false);
      iVar9 = (pIVar8->OpenPopupStack).Size;
      if (iVar9 == (pIVar8->OpenPopupStack).Capacity) {
        if (iVar9 == 0) {
          iVar12 = 8;
        }
        else {
          iVar12 = iVar9 / 2 + iVar9;
        }
        iVar14 = iVar9 + 1;
        if (iVar9 + 1 < iVar12) {
          iVar14 = iVar12;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pIVar10 = (ImGuiPopupData *)
                  (*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData);
        pIVar6 = (pIVar8->OpenPopupStack).Data;
        if (pIVar6 != (ImGuiPopupData *)0x0) {
          memcpy(pIVar10,pIVar6,(long)(pIVar8->OpenPopupStack).Size * 0x30);
          pIVar6 = (pIVar8->OpenPopupStack).Data;
          if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
        }
        (pIVar8->OpenPopupStack).Data = pIVar10;
        (pIVar8->OpenPopupStack).Capacity = iVar14;
        iVar9 = (pIVar8->OpenPopupStack).Size;
      }
      else {
        pIVar10 = (pIVar8->OpenPopupStack).Data;
      }
      lVar11 = (long)iVar9;
      pIVar10[lVar11].PopupId = id;
      *(undefined4 *)&pIVar10[lVar11].field_0x4 = 0;
      pIVar10[lVar11].Window = (ImGuiWindow *)0x0;
      pIVar10[lVar11].SourceWindow = pIVar4;
      pIVar10[lVar11].OpenFrameCount = iVar2;
    }
    else {
      if (iVar12 == (pIVar8->OpenPopupStack).Capacity) {
        if (iVar12 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar12 / 2 + iVar12;
        }
        iVar14 = iVar12 + 1;
        if (iVar12 + 1 < iVar9) {
          iVar14 = iVar9;
        }
        piVar1 = &(pIVar8->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
        pIVar10 = (ImGuiPopupData *)
                  (*GImAllocatorAllocFunc)((long)iVar14 * 0x30,GImAllocatorUserData);
        pIVar6 = (pIVar8->OpenPopupStack).Data;
        if (pIVar6 != (ImGuiPopupData *)0x0) {
          memcpy(pIVar10,pIVar6,(long)(pIVar8->OpenPopupStack).Size * 0x30);
          pIVar6 = (pIVar8->OpenPopupStack).Data;
          if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
        }
        (pIVar8->OpenPopupStack).Data = pIVar10;
        (pIVar8->OpenPopupStack).Capacity = iVar14;
        iVar12 = (pIVar8->OpenPopupStack).Size;
      }
      else {
        pIVar10 = (pIVar8->OpenPopupStack).Data;
      }
      lVar11 = (long)iVar12;
      pIVar10[lVar11].PopupId = id;
      *(undefined4 *)&pIVar10[lVar11].field_0x4 = 0;
      pIVar10[lVar11].Window = (ImGuiWindow *)0x0;
      pIVar10[lVar11].SourceWindow = pIVar4;
      pIVar10[lVar11].OpenFrameCount = iVar2;
    }
    pIVar10[lVar11].OpenParentId = uVar3;
    pIVar10[lVar11].OpenPopupPos = IVar7;
    pIVar10[lVar11].OpenMousePos = IVar5;
    (pIVar8->OpenPopupStack).Size = (pIVar8->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.SourceWindow = g.NavWindow;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}